

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_geom.cxx
# Opt level: O1

void __thiscall xray_re::xr_level_geom::load_v9(xr_level_geom *this,xr_reader *r)

{
  d3d_vertex_element *pdVar1;
  uint32_t fvf;
  pointer pxVar2;
  d3d_vertex_element *ve;
  uint32_t *puVar3;
  pointer pxVar4;
  uint *puVar5;
  size_t n_ve;
  pointer pxVar6;
  pointer this_00;
  xr_reader *s;
  xr_reader *local_28;
  
  local_28 = xr_reader::open_chunk(r,0xc);
  if (local_28 == (xr_reader *)0x0) {
    local_28 = xr_reader::open_chunk(r,4);
    if (local_28 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_geom.cxx"
                    ,0x22,"void xray_re::xr_level_geom::load_v9(xr_reader &)");
    }
    puVar5 = (local_28->field_2).m_p_u32;
    (local_28->field_2).m_p = (uint8_t *)(puVar5 + 1);
    std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::resize
              (&this->m_vbufs,(ulong)*puVar5);
    pxVar2 = (this->m_vbufs).super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pxVar6 = (this->m_vbufs).
                  super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>._M_impl.
                  super__Vector_impl_data._M_start; pxVar6 != pxVar2; pxVar6 = pxVar6 + 1) {
      puVar3 = (local_28->field_2).m_p_u32;
      (local_28->field_2).m_p = (uint8_t *)(puVar3 + 1);
      fvf = *puVar3;
      (local_28->field_2).m_p = (uint8_t *)(puVar3 + 2);
      xr_vbuf::load_d3d7(pxVar6,local_28,(ulong)puVar3[1],fvf);
    }
  }
  else {
    puVar5 = (local_28->field_2).m_p_u32;
    (local_28->field_2).m_p = (uint8_t *)(puVar5 + 1);
    std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::resize
              (&this->m_vbufs,(ulong)*puVar5);
    pxVar2 = (this->m_vbufs).super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pxVar6 = (this->m_vbufs).
                  super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>._M_impl.
                  super__Vector_impl_data._M_start; pxVar6 != pxVar2; pxVar6 = pxVar6 + 1) {
      ve = (d3d_vertex_element *)(local_28->field_2).m_p;
      pdVar1 = ve + 1;
      (local_28->field_2).m_p = (uint8_t *)pdVar1;
      if ((d3d_vertex_element *)local_28->m_end < pdVar1) {
LAB_0016a033:
        __assert_fail("m_p <= m_end",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                      ,0x7c,"void xray_re::xr_reader::advance(size_t)");
      }
      puVar5 = (uint *)((local_28->field_2).m_p + 8);
      (local_28->field_2).m_p_u32 = puVar5;
      if (local_28->m_end < puVar5) goto LAB_0016a033;
      n_ve = 1;
      while ((char)puVar5[-1] != '\x11') {
        n_ve = n_ve + 1;
        puVar5 = puVar5 + 2;
        (local_28->field_2).m_p_u32 = puVar5;
        if (local_28->m_end < puVar5) goto LAB_0016a033;
      }
      (local_28->field_2).m_p = (uint8_t *)(puVar5 + 1);
      xr_vbuf::load_d3d9(pxVar6,local_28,(ulong)*puVar5,ve,n_ve);
    }
  }
  xr_reader::close_chunk(r,&local_28);
  local_28 = xr_reader::open_chunk(r,0xb);
  if (local_28 == (xr_reader *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_geom.cxx"
                  ,0x2d,"void xray_re::xr_level_geom::load_v9(xr_reader &)");
  }
  puVar5 = (local_28->field_2).m_p_u32;
  (local_28->field_2).m_p = (uint8_t *)(puVar5 + 1);
  std::vector<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>::resize
            (&this->m_ibufs,(ulong)*puVar5);
  pxVar4 = (this->m_ibufs).super__Vector_base<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_ibufs).
                 super__Vector_base<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pxVar4; this_00 = this_00 + 1) {
    puVar5 = (local_28->field_2).m_p_u32;
    (local_28->field_2).m_p = (uint8_t *)(puVar5 + 1);
    xr_ibuf::load(this_00,local_28,(ulong)*puVar5);
  }
  xr_reader::close_chunk(r,&local_28);
  return;
}

Assistant:

void xr_level_geom::load_v9(xr_reader& r)
{
	xr_reader* s = r.open_chunk(FSL9_VB);
	if (s) {
		m_vbufs.resize(s->r_u32());
		for (xr_vbuf_vec_it it = m_vbufs.begin(), end = m_vbufs.end(); it != end; ++it) {
			const d3d_vertex_element *ve = s->skip<d3d_vertex_element>();
			size_t n_ve = 1;
			for (; s->skip<d3d_vertex_element>()->type != D3D_VE_TYPE_UNUSED; ++n_ve) {}
			it->load_d3d9(*s, s->r_u32(), ve, n_ve);
		}
		r.close_chunk(s);
	} else {
		s = r.open_chunk(FSL9_VB_OLD);
		xr_assert(s);
		m_vbufs.resize(s->r_u32());
		for (xr_vbuf_vec_it it = m_vbufs.begin(), end = m_vbufs.end(); it != end; ++it) {
			uint32_t fvf = s->r_u32();
			size_t n = s->r_u32();
			it->load_d3d7(*s, n, fvf);
		}
		r.close_chunk(s);
	}

	s = r.open_chunk(FSL9_IB);
	xr_assert(s);
	m_ibufs.resize(s->r_u32());
	for (xr_ibuf_vec_it it = m_ibufs.begin(), end = m_ibufs.end(); it != end; ++it)
		it->load(*s, s->r_u32());
	r.close_chunk(s);
}